

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

TemplateDictionary * anon_unknown.dwarf_39a3::GetSectionDict(TemplateDictionary *d,char *name,int i)

{
  value_type pTVar1;
  int iVar2;
  reference ppTVar3;
  TemplateString local_60;
  undefined1 local_40 [8];
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  dicts;
  TemplateDictionaryPeer peer;
  int i_local;
  char *name_local;
  TemplateDictionary *d_local;
  
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer
            ((TemplateDictionaryPeer *)
             &dicts.
              super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,d);
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            *)local_40);
  ctemplate::TemplateString::TemplateString(&local_60,name);
  iVar2 = ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
                    ((TemplateDictionaryPeer *)
                     &dicts.
                      super__Vector_base<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_60,
                     (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                      *)local_40);
  if (i <= iVar2) {
    ppTVar3 = std::
              vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
              ::operator[]((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                            *)local_40,(long)i);
    pTVar1 = *ppTVar3;
    std::
    vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
    ::~vector((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
               *)local_40);
    return pTVar1;
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","peer.GetSectionDictionaries(name, &dicts)",">=","i");
  exit(1);
}

Assistant:

static const TemplateDictionary* GetSectionDict(
    const TemplateDictionary* d, const char* name, int i) {
  TemplateDictionaryPeer peer(d);
  vector<const TemplateDictionary*> dicts;
  EXPECT_GE(peer.GetSectionDictionaries(name, &dicts), i);
  return dicts[i];
}